

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_sse41_128_32.c
# Opt level: O3

parasail_result_t *
parasail_nw_scan_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int *piVar1;
  uint *puVar2;
  int *piVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  ulong uVar6;
  uint uVar7;
  parasail_result_t *ppVar8;
  __m128i *ptr;
  int32_t *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  __m128i *palVar19;
  __m128i *palVar20;
  uint uVar21;
  int iVar22;
  int iVar29;
  int iVar31;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar30;
  uint uVar32;
  int iVar33;
  uint uVar34;
  undefined1 auVar28 [16];
  undefined1 auVar35 [16];
  uint uVar36;
  uint uVar38;
  uint uVar39;
  undefined1 auVar37 [16];
  uint uVar40;
  int32_t iVar41;
  int iVar42;
  int iVar44;
  undefined1 auVar43 [16];
  uint uVar45;
  uint uVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  undefined1 auVar46 [16];
  int iVar51;
  uint uVar52;
  int iVar53;
  uint uVar55;
  int iVar56;
  uint uVar57;
  int iVar58;
  undefined1 in_XMM10 [16];
  undefined1 auVar54 [16];
  uint uVar59;
  uint uVar61;
  uint uVar62;
  undefined1 in_XMM11 [16];
  undefined1 auVar60 [16];
  int iVar63;
  uint uVar64;
  int iVar65;
  int iVar67;
  int iVar68;
  __m128i alVar66;
  int iVar69;
  undefined1 in_XMM13 [16];
  undefined1 auVar70 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar71 [16];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_scan_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_scan_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_scan_profile_sse41_128_32_cold_6();
      }
      else {
        uVar12 = profile->s1Len;
        if ((int)uVar12 < 1) {
          parasail_nw_scan_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_scan_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_nw_scan_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_nw_scan_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_nw_scan_profile_sse41_128_32_cold_1();
        }
        else {
          uVar14 = uVar12 - 1;
          uVar18 = (ulong)uVar12 + 3 >> 2;
          iVar22 = -open;
          iVar16 = ppVar5->min;
          uVar12 = 0x80000000 - iVar16;
          if (iVar16 != iVar22 && SBORROW4(iVar16,iVar22) == iVar16 + open < 0) {
            uVar12 = open | 0x80000000;
          }
          uVar7 = 0x7ffffffe - ppVar5->max;
          ppVar8 = parasail_result_new();
          if (ppVar8 != (parasail_result_t *)0x0) {
            iVar16 = (int)(uVar14 / uVar18);
            ppVar8->flag = ppVar8->flag | 0x4400401;
            ptr = parasail_memalign___m128i(0x10,uVar18);
            ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            ptr_01 = parasail_memalign___m128i(0x10,uVar18);
            ptr_02 = parasail_memalign___m128i(0x10,uVar18);
            ptr_03 = parasail_memalign___m128i(0x10,uVar18);
            if (ptr_03 != (__m128i *)0x0 &&
                ((ptr_02 != (__m128i *)0x0 && ptr_01 != (__m128i *)0x0) &&
                (ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0))) {
              iVar9 = s2Len + -1;
              uVar10 = 3 - iVar16;
              uVar12 = uVar12 + 1;
              iVar44 = (int)uVar18;
              iVar15 = -(iVar44 * gap);
              auVar37._4_4_ = iVar22;
              auVar37._0_4_ = iVar22;
              auVar37._8_4_ = iVar22;
              auVar37._12_4_ = iVar22;
              auVar43._0_8_ = CONCAT44(0,open);
              auVar43._8_4_ = open;
              auVar43._12_4_ = 0;
              auVar46._8_4_ = iVar44;
              auVar46._0_8_ = uVar18;
              auVar46._12_4_ = 0;
              auVar54 = pmovsxbq(in_XMM10,0x302);
              auVar54 = pmuldq(auVar54,auVar46);
              auVar46 = pmuldq(auVar46,_DAT_00903a90);
              uVar17 = 0;
              auVar60 = pmovsxdq(in_XMM11,0x8000000080000000);
              palVar19 = ptr_02;
              palVar20 = ptr;
              do {
                auVar71._8_4_ = (int)uVar17;
                auVar71._0_8_ = uVar17;
                auVar71._12_4_ = (int)(uVar17 >> 0x20);
                auVar23._0_4_ = (undefined4)(uVar17 + auVar46._0_8_);
                auVar23._4_4_ = (int)(auVar71._8_8_ + auVar46._8_8_);
                auVar23._8_4_ = (int)(auVar54._0_8_ + uVar17);
                auVar23._12_4_ = (int)(auVar54._8_8_ + auVar71._8_8_);
                auVar24._4_4_ = gap;
                auVar24._0_4_ = gap;
                auVar24._8_4_ = gap;
                auVar24._12_4_ = gap;
                auVar24 = pmulld(auVar23,auVar24);
                alVar66[0]._0_4_ = iVar22 - auVar24._0_4_;
                alVar66[0]._4_4_ = iVar22 - auVar24._4_4_;
                alVar66[1]._0_4_ = iVar22 - auVar24._8_4_;
                alVar66[1]._4_4_ = iVar22 - auVar24._12_4_;
                auVar24 = pmovsxdq(in_XMM13,(undefined1  [16])alVar66);
                auVar25._4_4_ = alVar66[1]._4_4_;
                auVar25._0_4_ = (int)alVar66[1];
                auVar25._8_4_ = (int)alVar66[1];
                auVar25._12_4_ = alVar66[1]._4_4_;
                auVar71 = pmovsxdq(in_XMM14,auVar25);
                in_XMM14._0_8_ = auVar71._0_8_ - auVar43._0_8_;
                in_XMM14._8_8_ = auVar71._8_8_ - (ulong)(uint)open;
                auVar70._0_8_ = auVar24._0_8_ - auVar43._0_8_;
                auVar70._8_8_ = auVar24._8_8_ - (ulong)(uint)open;
                auVar26._0_8_ = -(ulong)(auVar60._0_8_ < auVar70._0_8_);
                auVar26._8_8_ = -(ulong)(auVar60._8_8_ < auVar70._8_8_);
                auVar24 = blendvpd(auVar60,auVar70,auVar26);
                auVar27._0_8_ = -(ulong)(auVar60._0_8_ < in_XMM14._0_8_);
                auVar27._8_8_ = -(ulong)(auVar60._8_8_ < in_XMM14._8_8_);
                in_XMM13 = blendvpd(auVar60,in_XMM14,auVar27);
                *palVar19 = alVar66;
                *(int *)*palVar20 = auVar24._0_4_;
                *(int *)((long)*palVar20 + 4) = auVar24._8_4_;
                *(int *)(*palVar20 + 1) = in_XMM13._0_4_;
                *(int *)((long)*palVar20 + 0xc) = in_XMM13._8_4_;
                uVar17 = uVar17 + 1;
                palVar20 = palVar20 + 1;
                palVar19 = palVar19 + 1;
              } while (uVar18 != uVar17);
              *ptr_00 = 0;
              auVar46 = _DAT_00906ca0;
              uVar11 = s2Len + 3U & 0xfffffffc;
              lVar13 = (ulong)(uint)s2Len - 1;
              auVar54._8_4_ = (int)lVar13;
              auVar54._0_8_ = lVar13;
              auVar54._12_4_ = (int)((ulong)lVar13 >> 0x20);
              uVar17 = 0;
              auVar37 = pmovsxbq(auVar37,0x302);
              auVar43 = pmovsxbq(auVar43,0x100);
              auVar54 = auVar54 ^ _DAT_00906ca0;
              do {
                uVar6 = auVar46._0_8_;
                lVar13 = auVar54._0_8_;
                if ((bool)(~(lVar13 < (long)(uVar17 ^ uVar6)) & 1)) {
                  ptr_00[uVar17 + 1] = iVar22;
                }
                auVar60._8_4_ = (int)uVar17;
                auVar60._0_8_ = uVar17;
                auVar60._12_4_ = (int)(uVar17 >> 0x20);
                if ((long)((auVar60._8_8_ | auVar43._8_8_) ^ auVar46._8_8_) <= auVar54._8_8_) {
                  ptr_00[uVar17 + 2] = iVar22 - gap;
                }
                if ((long)((uVar17 | auVar37._0_8_) ^ uVar6) <= lVar13) {
                  ptr_00[uVar17 + 3] = gap * -2 + iVar22;
                  ptr_00[uVar17 + 4] = gap * -3 + iVar22;
                }
                uVar17 = uVar17 + 4;
                iVar22 = iVar22 + gap * -4;
              } while (uVar11 != uVar17);
              iVar22 = -open;
              iVar29 = -open;
              iVar31 = -open;
              iVar33 = -open;
              palVar19 = ptr_03 + (iVar44 - 1U);
              uVar17 = uVar18;
              do {
                *(int *)*palVar19 = iVar22;
                *(int *)((long)*palVar19 + 4) = iVar29;
                *(int *)(*palVar19 + 1) = iVar31;
                *(int *)((long)*palVar19 + 0xc) = iVar33;
                iVar22 = iVar22 - gap;
                iVar29 = iVar29 - gap;
                iVar31 = iVar31 - gap;
                iVar33 = iVar33 - gap;
                palVar19 = palVar19 + -1;
                iVar48 = (int)uVar17;
                uVar21 = iVar48 - 1;
                uVar17 = (ulong)uVar21;
              } while (uVar21 != 0 && 0 < iVar48);
              palVar19 = ptr_02 + (iVar44 - 1U);
              uVar17 = 0;
              uVar21 = uVar12;
              uVar30 = uVar12;
              uVar32 = uVar12;
              uVar34 = uVar12;
              uVar36 = uVar7;
              uVar38 = uVar7;
              uVar39 = uVar7;
              uVar40 = uVar7;
              do {
                iVar22 = ppVar5->mapper[(byte)s2[uVar17]];
                uVar52 = uVar12 - (int)(*ptr_03)[0];
                uVar55 = uVar12 - *(int *)((long)*ptr_03 + 4);
                uVar57 = uVar12 - (int)(*ptr_03)[1];
                lVar13 = 0;
                iVar41 = ptr_00[uVar17];
                iVar44 = (int)(*palVar19)[0];
                iVar29 = *(int *)((long)*palVar19 + 4);
                iVar31 = (int)(*palVar19)[1];
                uVar45 = uVar12;
                uVar47 = uVar12;
                uVar49 = uVar12;
                do {
                  piVar3 = (int *)((long)*ptr_02 + lVar13);
                  iVar33 = *piVar3;
                  iVar48 = piVar3[1];
                  iVar50 = piVar3[2];
                  iVar51 = piVar3[3];
                  piVar3 = (int *)((long)*ptr + lVar13);
                  piVar1 = (int *)((long)pvVar4 + lVar13 + (long)iVar22 * uVar18 * 0x10);
                  iVar42 = iVar41 + *piVar1;
                  iVar44 = iVar44 + piVar1[1];
                  iVar29 = iVar29 + piVar1[2];
                  iVar31 = iVar31 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_03 + lVar13);
                  iVar53 = uVar52 + *piVar1;
                  iVar56 = uVar55 + piVar1[1];
                  iVar58 = uVar57 + piVar1[2];
                  iVar65 = *piVar3 - gap;
                  iVar67 = piVar3[1] - gap;
                  iVar68 = piVar3[2] - gap;
                  iVar69 = piVar3[3] - gap;
                  uVar45 = (uint)((int)uVar45 < iVar53) * iVar53 | ((int)uVar45 >= iVar53) * uVar45;
                  uVar47 = (uint)((int)uVar47 < iVar56) * iVar56 | ((int)uVar47 >= iVar56) * uVar47;
                  uVar49 = (uint)((int)uVar49 < iVar58) * iVar58 | ((int)uVar49 >= iVar58) * uVar49;
                  iVar53 = iVar33 - open;
                  iVar56 = iVar48 - open;
                  iVar58 = iVar50 - open;
                  iVar63 = iVar51 - open;
                  uVar59 = (uint)(iVar53 < iVar65) * iVar65 | (uint)(iVar53 >= iVar65) * iVar53;
                  uVar61 = (uint)(iVar56 < iVar67) * iVar67 | (uint)(iVar56 >= iVar67) * iVar56;
                  uVar62 = (uint)(iVar58 < iVar68) * iVar68 | (uint)(iVar58 >= iVar68) * iVar58;
                  uVar64 = (uint)(iVar63 < iVar69) * iVar69 | (uint)(iVar63 >= iVar69) * iVar63;
                  uVar52 = (iVar42 < (int)uVar59) * uVar59 | (uint)(iVar42 >= (int)uVar59) * iVar42;
                  uVar55 = (iVar44 < (int)uVar61) * uVar61 | (uint)(iVar44 >= (int)uVar61) * iVar44;
                  uVar57 = (iVar29 < (int)uVar62) * uVar62 | (uint)(iVar29 >= (int)uVar62) * iVar29;
                  puVar2 = (uint *)((long)*ptr + lVar13);
                  *puVar2 = uVar59;
                  puVar2[1] = uVar61;
                  puVar2[2] = uVar62;
                  puVar2[3] = uVar64;
                  puVar2 = (uint *)((long)*ptr_01 + lVar13);
                  *puVar2 = uVar52;
                  puVar2[1] = uVar55;
                  puVar2[2] = uVar57;
                  puVar2[3] = (iVar31 < (int)uVar64) * uVar64 |
                              (uint)(iVar31 >= (int)uVar64) * iVar31;
                  lVar13 = lVar13 + 0x10;
                  iVar41 = iVar33;
                  iVar44 = iVar48;
                  iVar29 = iVar50;
                  iVar31 = iVar51;
                } while (uVar18 << 4 != lVar13);
                iVar22 = ptr_00[uVar17 + 1];
                uVar17 = uVar17 + 1;
                iVar44 = (int)(*ptr_03)[0] + iVar22;
                iVar29 = *(int *)((long)*ptr_03 + 4) + uVar52;
                iVar31 = (int)(*ptr_03)[1] + uVar55;
                uVar45 = (uint)((int)uVar45 < iVar44) * iVar44 | ((int)uVar45 >= iVar44) * uVar45;
                uVar47 = (uint)((int)uVar47 < iVar29) * iVar29 | ((int)uVar47 >= iVar29) * uVar47;
                uVar49 = (uint)((int)uVar49 < iVar31) * iVar31 | ((int)uVar49 >= iVar31) * uVar49;
                iVar44 = uVar45 + iVar15;
                iVar29 = uVar47 + iVar15;
                uVar45 = ((int)uVar12 < (int)uVar45) * uVar45 |
                         ((int)uVar12 >= (int)uVar45) * uVar12;
                uVar47 = (iVar44 < (int)uVar47) * uVar47 | (uint)(iVar44 >= (int)uVar47) * iVar44;
                uVar49 = (iVar29 < (int)uVar49) * uVar49 | (uint)(iVar29 >= (int)uVar49) * iVar29;
                iVar44 = uVar45 + iVar15;
                iVar29 = uVar47 + iVar15;
                uVar59 = ((int)uVar12 < (int)uVar45) * uVar45 |
                         ((int)uVar12 >= (int)uVar45) * uVar12;
                uVar61 = (iVar44 < (int)uVar47) * uVar47 | (uint)(iVar44 >= (int)uVar47) * iVar44;
                uVar62 = (iVar29 < (int)uVar49) * uVar49 | (uint)(iVar29 >= (int)uVar49) * iVar29;
                uVar47 = (iVar22 < (int)uVar12) * uVar12 | (uint)(iVar22 >= (int)uVar12) * iVar22;
                uVar49 = ((int)uVar52 < (int)uVar59) * uVar59 |
                         ((int)uVar52 >= (int)uVar59) * uVar52;
                uVar52 = ((int)uVar55 < (int)uVar61) * uVar61 |
                         ((int)uVar55 >= (int)uVar61) * uVar55;
                uVar55 = ((int)uVar57 < (int)uVar62) * uVar62 |
                         ((int)uVar57 >= (int)uVar62) * uVar57;
                lVar13 = 0;
                uVar45 = uVar12;
                do {
                  iVar33 = uVar45 - gap;
                  iVar48 = uVar59 - gap;
                  iVar50 = uVar61 - gap;
                  iVar51 = uVar62 - gap;
                  iVar22 = uVar47 - open;
                  iVar44 = uVar49 - open;
                  iVar29 = uVar52 - open;
                  iVar31 = uVar55 - open;
                  uVar45 = (uint)(iVar33 < iVar22) * iVar22 | (uint)(iVar33 >= iVar22) * iVar33;
                  uVar59 = (uint)(iVar48 < iVar44) * iVar44 | (uint)(iVar48 >= iVar44) * iVar48;
                  uVar61 = (uint)(iVar50 < iVar29) * iVar29 | (uint)(iVar50 >= iVar29) * iVar50;
                  uVar62 = (uint)(iVar51 < iVar31) * iVar31 | (uint)(iVar51 >= iVar31) * iVar51;
                  piVar3 = (int *)((long)*ptr_01 + lVar13);
                  iVar22 = *piVar3;
                  iVar44 = piVar3[1];
                  iVar29 = piVar3[2];
                  iVar31 = piVar3[3];
                  uVar47 = (iVar22 < (int)uVar45) * uVar45 | (uint)(iVar22 >= (int)uVar45) * iVar22;
                  uVar49 = (iVar44 < (int)uVar59) * uVar59 | (uint)(iVar44 >= (int)uVar59) * iVar44;
                  uVar52 = (iVar29 < (int)uVar61) * uVar61 | (uint)(iVar29 >= (int)uVar61) * iVar29;
                  uVar55 = (iVar31 < (int)uVar62) * uVar62 | (uint)(iVar31 >= (int)uVar62) * iVar31;
                  puVar2 = (uint *)((long)*ptr_02 + lVar13);
                  *puVar2 = uVar47;
                  puVar2[1] = uVar49;
                  puVar2[2] = uVar52;
                  puVar2[3] = uVar55;
                  uVar36 = ((int)uVar47 < (int)uVar36) * uVar47 |
                           ((int)uVar47 >= (int)uVar36) * uVar36;
                  uVar38 = ((int)uVar49 < (int)uVar38) * uVar49 |
                           ((int)uVar49 >= (int)uVar38) * uVar38;
                  uVar39 = ((int)uVar52 < (int)uVar39) * uVar52 |
                           ((int)uVar52 >= (int)uVar39) * uVar39;
                  uVar40 = ((int)uVar55 < (int)uVar40) * uVar55 |
                           ((int)uVar55 >= (int)uVar40) * uVar40;
                  uVar21 = ((int)uVar21 < (int)uVar47) * uVar47 |
                           ((int)uVar21 >= (int)uVar47) * uVar21;
                  uVar30 = ((int)uVar30 < (int)uVar49) * uVar49 |
                           ((int)uVar30 >= (int)uVar49) * uVar30;
                  uVar32 = ((int)uVar32 < (int)uVar52) * uVar52 |
                           ((int)uVar32 >= (int)uVar52) * uVar32;
                  uVar34 = ((int)uVar34 < (int)uVar55) * uVar55 |
                           ((int)uVar34 >= (int)uVar55) * uVar34;
                  lVar13 = lVar13 + 0x10;
                } while (uVar18 << 4 != lVar13);
              } while (uVar17 != (uint)s2Len);
              uVar17 = ptr_02[(ulong)uVar14 % uVar18][1];
              if (iVar16 < 3) {
                iVar16 = 0;
                uVar18 = ptr_02[(ulong)uVar14 % uVar18][0];
                do {
                  uVar17 = uVar17 << 0x20 | uVar18 >> 0x20;
                  iVar16 = iVar16 + 1;
                  uVar11 = uVar10;
                  uVar18 = uVar18 << 0x20;
                } while (iVar16 < (int)uVar10);
              }
              auVar35._0_4_ = -(uint)((int)uVar36 < (int)uVar12);
              auVar35._4_4_ = -(uint)((int)uVar38 < (int)uVar12);
              auVar35._8_4_ = -(uint)((int)uVar39 < (int)uVar12);
              auVar35._12_4_ = -(uint)((int)uVar40 < (int)uVar12);
              auVar28._0_4_ = -(uint)((int)uVar7 < (int)uVar21);
              auVar28._4_4_ = -(uint)((int)uVar7 < (int)uVar30);
              auVar28._8_4_ = -(uint)((int)uVar7 < (int)uVar32);
              auVar28._12_4_ = -(uint)((int)uVar7 < (int)uVar34);
              iVar16 = movmskps(uVar11,auVar28 | auVar35);
              if (iVar16 == 0) {
                iVar16 = (int)(uVar17 >> 0x20);
              }
              else {
                *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
                iVar16 = 0;
                iVar9 = 0;
                uVar14 = 0;
              }
              ppVar8->score = iVar16;
              ppVar8->end_query = uVar14;
              ppVar8->end_ref = iVar9;
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar8;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi32(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHp = _mm_insert_epi32(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi32(
                    _mm_sub_epi32(vE, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vHp = _mm_add_epi32(vHp, vW);
            vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[i]));
            vHt = _mm_max_epi32(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHt = _mm_insert_epi32(vHt, boundary[j+1], 0);
        vF = _mm_max_epi32(vF, _mm_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            vF = _mm_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        vH = _mm_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi32(
                    _mm_sub_epi32(vF, vGapE),
                    _mm_sub_epi32(vH, vGapO));
            vH = _mm_max_epi32(vHt, vF);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}